

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::
MessageDifferencerTest_PartialEqualityTestTwoBoolsPresenceFieldMissingWithAddress_Test::TestBody
          (MessageDifferencerTest_PartialEqualityTestTwoBoolsPresenceFieldMissingWithAddress_Test
           *this)

{
  bool bVar1;
  Descriptor *this_00;
  FieldDescriptor *fd;
  char *pcVar2;
  char *in_R9;
  string local_5e8;
  AssertHelper local_5c8;
  Message local_5c0;
  bool local_5b1;
  undefined1 local_5b0 [8];
  AssertionResult gtest_ar__5;
  AssertHelper local_580;
  Message local_578;
  bool local_569;
  undefined1 local_568 [8];
  AssertionResult gtest_ar__4;
  AssertHelper local_538;
  Message local_530;
  bool local_521;
  undefined1 local_520 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_4f0;
  Message local_4e8;
  bool local_4d9;
  undefined1 local_4d8 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_4a8;
  Message local_4a0;
  bool local_491;
  undefined1 local_490 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_460;
  Message local_458;
  bool local_449;
  undefined1 local_448 [8];
  AssertionResult gtest_ar_;
  UnsetFieldsMetadata metadata;
  FieldDescriptor *fd1;
  TestNoPresenceField msg2;
  TestNoPresenceField msg1;
  MessageDifferencer default_differencer;
  undefined1 local_1c0 [8];
  MessageDifferencer address_differencer;
  MessageDifferencerTest_PartialEqualityTestTwoBoolsPresenceFieldMissingWithAddress_Test *this_local
  ;
  
  address_differencer.unpack_any_field_.dynamic_message_factory_._M_t.
  super___uniq_ptr_impl<google::protobuf::DynamicMessageFactory,_std::default_delete<google::protobuf::DynamicMessageFactory>_>
  ._M_t.
  super__Tuple_impl<0UL,_google::protobuf::DynamicMessageFactory_*,_std::default_delete<google::protobuf::DynamicMessageFactory>_>
  .super__Head_base<0UL,_google::protobuf::DynamicMessageFactory_*,_false>._M_head_impl =
       (unique_ptr<google::protobuf::DynamicMessageFactory,_std::default_delete<google::protobuf::DynamicMessageFactory>_>
        )(unique_ptr<google::protobuf::DynamicMessageFactory,_std::default_delete<google::protobuf::DynamicMessageFactory>_>
          )this;
  util::MessageDifferencer::MessageDifferencer((MessageDifferencer *)local_1c0);
  util::MessageDifferencer::set_scope((MessageDifferencer *)local_1c0,PARTIAL);
  util::MessageDifferencer::MessageDifferencer((MessageDifferencer *)((long)&msg1.field_0 + 0x30));
  util::MessageDifferencer::set_scope((MessageDifferencer *)((long)&msg1.field_0 + 0x30),PARTIAL);
  util::MessageDifferencer::set_force_compare_no_presence
            ((MessageDifferencer *)((long)&msg1.field_0 + 0x30),false);
  MakeTestNoPresenceField();
  MakeTestNoPresenceField();
  this_00 = proto3_unittest::TestNoPresenceField::GetDescriptor();
  fd = Descriptor::FindFieldByNumber(this_00,5);
  TextFormat::Parser::UnsetFieldsMetadata::UnsetFieldsMetadata
            ((UnsetFieldsMetadata *)&gtest_ar_.message_);
  internal::UnsetFieldsMetadataMessageDifferencerTestUtil::AddExplicitUnsetField
            ((Message *)((long)&msg2.field_0 + 0x30),fd,(UnsetFieldsMetadata *)&gtest_ar_.message_);
  util::MessageDifferencer::set_require_no_presence_fields
            ((MessageDifferencer *)local_1c0,(UnsetFieldsMetadata *)&gtest_ar_.message_);
  local_449 = util::MessageDifferencer::Compare
                        ((MessageDifferencer *)local_1c0,(Message *)((long)&msg2.field_0 + 0x30),
                         (Message *)&fd1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_448,&local_449,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_448);
  if (!bVar1) {
    testing::Message::Message(&local_458);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__1.message_,(internal *)local_448,
               (AssertionResult *)"address_differencer.Compare(msg1, msg2)","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_460,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
               ,0x1f7,pcVar2);
    testing::internal::AssertHelper::operator=(&local_460,&local_458);
    testing::internal::AssertHelper::~AssertHelper(&local_460);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(&local_458);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_448);
  local_491 = util::MessageDifferencer::Compare
                        ((MessageDifferencer *)((long)&msg1.field_0 + 0x30),
                         (Message *)((long)&msg2.field_0 + 0x30),(Message *)&fd1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_490,&local_491,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_490);
  if (!bVar1) {
    testing::Message::Message(&local_4a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__2.message_,(internal *)local_490,
               (AssertionResult *)"default_differencer.Compare(msg1, msg2)","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_4a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
               ,0x1f8,pcVar2);
    testing::internal::AssertHelper::operator=(&local_4a8,&local_4a0);
    testing::internal::AssertHelper::~AssertHelper(&local_4a8);
    std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
    testing::Message::~Message(&local_4a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_490);
  proto3_unittest::TestNoPresenceField::clear_no_presence_bool2
            ((TestNoPresenceField *)((long)&msg2.field_0 + 0x30));
  bVar1 = util::MessageDifferencer::Compare
                    ((MessageDifferencer *)local_1c0,(Message *)((long)&msg2.field_0 + 0x30),
                     (Message *)&fd1);
  local_4d9 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_4d8,&local_4d9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4d8);
  if (!bVar1) {
    testing::Message::Message(&local_4e8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__3.message_,(internal *)local_4d8,
               (AssertionResult *)"address_differencer.Compare(msg1, msg2)","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_4f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
               ,0x1fd,pcVar2);
    testing::internal::AssertHelper::operator=(&local_4f0,&local_4e8);
    testing::internal::AssertHelper::~AssertHelper(&local_4f0);
    std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
    testing::Message::~Message(&local_4e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4d8);
  local_521 = util::MessageDifferencer::Compare
                        ((MessageDifferencer *)((long)&msg1.field_0 + 0x30),
                         (Message *)((long)&msg2.field_0 + 0x30),(Message *)&fd1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_520,&local_521,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_520);
  if (!bVar1) {
    testing::Message::Message(&local_530);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__4.message_,(internal *)local_520,
               (AssertionResult *)"default_differencer.Compare(msg1, msg2)","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_538,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
               ,0x1fe,pcVar2);
    testing::internal::AssertHelper::operator=(&local_538,&local_530);
    testing::internal::AssertHelper::~AssertHelper(&local_538);
    std::__cxx11::string::~string((string *)&gtest_ar__4.message_);
    testing::Message::~Message(&local_530);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_520);
  proto3_unittest::TestNoPresenceField::set_no_presence_bool2
            ((TestNoPresenceField *)((long)&msg2.field_0 + 0x30),true);
  proto3_unittest::TestNoPresenceField::clear_no_presence_bool3
            ((TestNoPresenceField *)((long)&msg2.field_0 + 0x30));
  local_569 = util::MessageDifferencer::Compare
                        ((MessageDifferencer *)local_1c0,(Message *)((long)&msg2.field_0 + 0x30),
                         (Message *)&fd1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_568,&local_569,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_568);
  if (!bVar1) {
    testing::Message::Message(&local_578);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__5.message_,(internal *)local_568,
               (AssertionResult *)"address_differencer.Compare(msg1, msg2)","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_580,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
               ,0x204,pcVar2);
    testing::internal::AssertHelper::operator=(&local_580,&local_578);
    testing::internal::AssertHelper::~AssertHelper(&local_580);
    std::__cxx11::string::~string((string *)&gtest_ar__5.message_);
    testing::Message::~Message(&local_578);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_568);
  local_5b1 = util::MessageDifferencer::Compare
                        ((MessageDifferencer *)((long)&msg1.field_0 + 0x30),
                         (Message *)((long)&msg2.field_0 + 0x30),(Message *)&fd1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_5b0,&local_5b1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5b0);
  if (!bVar1) {
    testing::Message::Message(&local_5c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_5e8,(internal *)local_5b0,
               (AssertionResult *)"default_differencer.Compare(msg1, msg2)","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_5c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
               ,0x205,pcVar2);
    testing::internal::AssertHelper::operator=(&local_5c8,&local_5c0);
    testing::internal::AssertHelper::~AssertHelper(&local_5c8);
    std::__cxx11::string::~string((string *)&local_5e8);
    testing::Message::~Message(&local_5c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5b0);
  TextFormat::Parser::UnsetFieldsMetadata::~UnsetFieldsMetadata
            ((UnsetFieldsMetadata *)&gtest_ar_.message_);
  proto3_unittest::TestNoPresenceField::~TestNoPresenceField((TestNoPresenceField *)&fd1);
  proto3_unittest::TestNoPresenceField::~TestNoPresenceField
            ((TestNoPresenceField *)((long)&msg2.field_0 + 0x30));
  util::MessageDifferencer::~MessageDifferencer((MessageDifferencer *)((long)&msg1.field_0 + 0x30));
  util::MessageDifferencer::~MessageDifferencer((MessageDifferencer *)local_1c0);
  return;
}

Assistant:

TEST(MessageDifferencerTest,
     PartialEqualityTestTwoBoolsPresenceFieldMissingWithAddress) {
  util::MessageDifferencer address_differencer;
  address_differencer.set_scope(util::MessageDifferencer::PARTIAL);

  // This differencer is not setting force_compare_no_presence.
  util::MessageDifferencer default_differencer;
  default_differencer.set_scope(util::MessageDifferencer::PARTIAL);
  default_differencer.set_force_compare_no_presence(false);

  // When clearing a singular no presence field, it will be included in the
  // comparison.
  proto3_unittest::TestNoPresenceField msg1 = MakeTestNoPresenceField();
  proto3_unittest::TestNoPresenceField msg2 = MakeTestNoPresenceField();

  const FieldDescriptor* fd1 = msg1.GetDescriptor()->FindFieldByNumber(5);
  TextFormat::Parser::UnsetFieldsMetadata metadata;
  UnsetFieldsMetadataMessageDifferencerTestUtil::AddExplicitUnsetField(
      msg1, *fd1, &metadata);
  address_differencer.set_require_no_presence_fields(metadata);

  EXPECT_TRUE(address_differencer.Compare(msg1, msg2));
  EXPECT_TRUE(default_differencer.Compare(msg1, msg2));

  // Trigger on bool2.
  msg1.clear_no_presence_bool2();

  EXPECT_FALSE(address_differencer.Compare(msg1, msg2));
  EXPECT_TRUE(default_differencer.Compare(msg1, msg2));

  // Triggering on bool2 still ignores bool3.
  msg1.set_no_presence_bool2(true);
  msg1.clear_no_presence_bool3();

  EXPECT_TRUE(address_differencer.Compare(msg1, msg2));
  EXPECT_TRUE(default_differencer.Compare(msg1, msg2));
}